

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseValueTypeList(WastParser *this,TypeVector *out_type_list)

{
  iterator __position;
  TokenType TVar1;
  Type local_64;
  Token local_60;
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    do {
      Consume(&local_60,this);
      if (local_60.token_type_ != First_Type) {
        __assert_fail("HasType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                      ,0x60,"Type wabt::Token::type() const");
      }
      local_64.enum_ = (Enum)local_60.field_2.type_.enum_;
      __position._M_current =
           (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_realloc_insert<wabt::Type>
                  (out_type_list,__position,&local_64);
      }
      else {
        (__position._M_current)->enum_ = (Enum)local_60.field_2.type_.enum_;
        (out_type_list->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      TVar1 = Peek(this,0);
    } while (TVar1 == First_Type);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list) {
  WABT_TRACE(ParseValueTypeList);
  while (PeekMatch(TokenType::ValueType))
    out_type_list->push_back(Consume().type());

  return Result::Ok;
}